

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O3

char * ulocimp_toBcpKey_63(char *key)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = init((EVP_PKEY_CTX *)key);
  if (((char)iVar1 != '\0') && (pvVar2 = uhash_get_63(gLocExtKeyMap,key), pvVar2 != (void *)0x0)) {
    return *(char **)((long)pvVar2 + 8);
  }
  return (char *)0x0;
}

Assistant:

U_CFUNC const char*
ulocimp_toBcpKey(const char* key) {
    if (!init()) {
        return NULL;
    }

    LocExtKeyData* keyData = (LocExtKeyData*)uhash_get(gLocExtKeyMap, key);
    if (keyData != NULL) {
        return keyData->bcpId;
    }
    return NULL;
}